

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lca.cpp
# Opt level: O0

int lca(int a,int b)

{
  int local_1c;
  int local_18;
  int l_1;
  int l;
  int b_local;
  int a_local;
  
  l_1 = b;
  l = a;
  if (d[a] < d[b]) {
    std::swap<int>(&l,&l_1);
  }
  for (local_18 = 0x13; -1 < local_18; local_18 = local_18 + -1) {
    if ((pred[l][local_18] != -1) && (d[l_1] <= d[pred[l][local_18]])) {
      l = pred[l][local_18];
    }
  }
  if (l == l_1) {
    b_local = l;
  }
  else {
    for (local_1c = 0x13; -1 < local_1c; local_1c = local_1c + -1) {
      if (pred[l][local_1c] != pred[l_1][local_1c]) {
        l = pred[l][local_1c];
        l_1 = pred[l_1][local_1c];
      }
    }
    b_local = pred[l][0];
  }
  return b_local;
}

Assistant:

int lca(int a, int b) {
    if (d[a] < d[b]) swap(a, b);
    per(l, 0, LOG) {
        if (pred[a][l] != -1 && d[pred[a][l]] >= d[b]) a = pred[a][l];
    }
    if (a == b) return a;
    per(l, 0, LOG) if (pred[a][l] != pred[b][l]) {
        a = pred[a][l];
        b = pred[b][l];
    }
    return pred[a][0];
}